

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_zlib_inflate_table(uchar *codes,size_t codes_len,uint16_t *zdebug_table,uint16_t *table)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint16_t uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint16_t uStack_e8;
  ushort local_e6 [3];
  uint16_t start [16];
  uint16_t prev [16];
  uint16_t firstcode [7];
  uint16_t uStack_78;
  ushort auStack_76 [3];
  uint16_t count [16];
  
  _uStack_78 = 0;
  count[0] = 0;
  count[1] = 0;
  count[2] = 0;
  count[3] = 0;
  count[4] = 0;
  count[5] = 0;
  count[6] = 0;
  count[7] = 0;
  count[8] = 0;
  count[9] = 0;
  count[10] = 0;
  count[0xb] = 0;
  for (sVar5 = 0; codes_len != sVar5; sVar5 = sVar5 + 1) {
    bVar2 = codes[sVar5];
    uVar12 = (ulong)bVar2;
    if (0xf < uVar12) {
      return 0;
    }
    uVar9 = (uint16_t)sVar5;
    if (count[uVar12 - 4] == 0) {
      *(uint16_t *)((long)&uStack_e8 + (ulong)((uint)bVar2 + (uint)bVar2)) = uVar9;
      *(uint16_t *)((long)start + (ulong)((uint)bVar2 + (uint)bVar2) + 0x18) = uVar9;
      uVar9 = 1;
    }
    else {
      zdebug_table[(ulong)start[uVar12 + 0xc] + 0x800] = uVar9;
      uVar12 = (ulong)codes[sVar5];
      uVar7 = (ulong)((uint)codes[sVar5] * 2);
      *(uint16_t *)((long)start + uVar7 + 0x18) = uVar9;
      uVar9 = *(short *)((long)count + (uVar7 - 8)) + 1;
    }
    count[uVar12 - 4] = uVar9;
  }
  memset(table,0,0x800);
  uVar12 = 0;
  for (lVar10 = 1; lVar10 != 9; lVar10 = lVar10 + 1) {
    uVar3 = count[lVar10 + -4];
    if (uVar3 != 0) {
      uVar18 = 1 << ((byte)lVar10 & 0x1f);
      uVar15 = (uint)uVar3;
      if (uVar18 < uVar15) {
        return 0;
      }
      uVar16 = (ulong)local_e6[lVar10 + -1];
      uVar21 = 1 << ((byte)(lVar10 + -1) & 0x1f);
      uVar7 = 0;
      while (uVar7 != uVar15) {
        if (0x1ff < (uint)uVar16) {
          return 0;
        }
        uVar19 = (uint)uVar12;
        for (; uVar12 < 0x100; uVar12 = uVar12 + uVar18) {
          if (table[uVar12] != 0) {
            return 0;
          }
          table[uVar12] = (short)(lVar10 + -1) * 0x200 | (ushort)uVar16;
        }
        uVar7 = uVar7 + 1;
        uVar13 = uVar21;
        if (uVar7 < uVar15) {
          uVar16 = (ulong)zdebug_table[uVar16 + 0x800];
        }
        do {
          uVar24 = uVar13;
          uVar13 = uVar24 >> 1;
        } while ((uVar24 & uVar19) != 0);
        uVar12 = (ulong)((uVar24 - 1 & uVar19) + uVar24);
        if (uVar24 == 0) {
          uVar12 = 0;
        }
      }
    }
  }
  lVar10 = 9;
  do {
    if (lVar10 == 0x10) {
      uVar12 = 0xf;
      uVar7 = 0;
      do {
        if (uVar12 < 9) {
          return 1;
        }
        uVar16 = (ulong)count[uVar12 - 4];
        if (uVar16 != 0) {
          uVar20 = (ulong)local_e6[uVar12 - 1];
          uVar23 = (ulong)prev[uVar12 + 4];
          uVar1 = uVar12 - 8;
          uVar18 = 1 << ((byte)uVar1 & 0x1f);
          uVar3 = (short)uVar1 * 0x200;
          bVar2 = (char)uVar12 - 1U & 0x1f;
          uVar15 = 1 << bVar2;
          uVar14 = 0x100;
          uVar22 = (ulong)(uint)(0 << bVar2);
          uVar8 = 0;
          uVar17 = 0;
          while (uVar17 != uVar16) {
            uVar11 = uVar23 & 0xff;
            uVar6 = uVar7;
            if (uVar14 != uVar11) {
              uVar4 = table[uVar11];
              uVar14 = uVar11;
              if (uVar4 == 0) {
                if (0x1ff < uVar7) {
                  return 0;
                }
                table[uVar11] = ((ushort)uVar7 | uVar3) + 0x1000;
                uVar6 = (long)(int)uVar18 + uVar7;
                uVar8 = uVar1;
                uVar22 = uVar7;
              }
              else {
                if ((uVar4 >> 0xc & 1) == 0) {
                  return 0;
                }
                uVar8 = (ulong)(uVar4 >> 9 & 7);
                if (uVar8 < uVar1) {
                  return 0;
                }
                uVar22 = (ulong)(uVar4 & 0x1ff);
              }
            }
            for (uVar7 = uVar23 >> 8; uVar7 < (uint)(1 << ((byte)uVar8 & 0x1f));
                uVar7 = uVar7 + uVar18) {
              if (table[uVar22 + uVar7 + 0x100] != 0) {
                return 0;
              }
              table[uVar22 + uVar7 + 0x100] = uVar3 | (ushort)uVar20;
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar15;
            if (uVar17 < uVar16) {
              uVar20 = (ulong)zdebug_table[uVar20 + 0x800];
            }
            do {
              uVar19 = uVar21;
              uVar21 = uVar19 >> 1;
            } while ((uVar19 & (uint)uVar23) != 0);
            uVar21 = (uVar19 - 1 & (uint)uVar23) + uVar19;
            if (uVar19 == 0) {
              uVar21 = 0;
            }
            uVar23 = (ulong)uVar21;
            uVar7 = uVar6;
          }
        }
        uVar12 = uVar12 - 1;
      } while( true );
    }
    uVar15 = (uint)count[lVar10 + -4];
    if (count[lVar10 + -4] != 0) {
      prev[lVar10 + 4] = (uint16_t)uVar12;
      uVar7 = 0;
      while (uVar18 = (uint)uVar7, uVar18 < (uint)lVar10) {
        if ((uVar15 >> (uVar18 & 0x1f) & 1) != 0) {
          uVar19 = 1 << ((char)(lVar10 - uVar7) - 1U & 0x1f);
          for (uVar21 = 0; (ulong)uVar21 < lVar10 - uVar7; uVar21 = uVar21 + 1) {
            uVar13 = (uint)uVar12;
            if ((uVar19 & uVar13) == 0) {
              uVar12 = (ulong)(uVar13 + uVar19);
              break;
            }
            uVar12 = (ulong)(uVar13 & ~uVar19);
            uVar19 = uVar19 >> 1;
          }
          uVar15 = uVar15 & ~(1 << ((byte)uVar7 & 0x1f));
        }
        uVar7 = (ulong)(uVar18 + 1);
      }
      if (uVar15 != 0) {
        return 0;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static int
elf_zlib_inflate_table (unsigned char *codes, size_t codes_len,
			uint16_t *zdebug_table, uint16_t *table)
{
  uint16_t count[16];
  uint16_t start[16];
  uint16_t prev[16];
  uint16_t firstcode[7];
  uint16_t *next;
  size_t i;
  size_t j;
  unsigned int code;
  size_t next_secondary;

  /* Count the number of code of each length.  Set NEXT[val] to be the
     next value after VAL with the same bit length.  */

  next = (uint16_t *) (((unsigned char *) zdebug_table)
		       + ZLIB_TABLE_WORK_OFFSET);

  memset (&count[0], 0, 16 * sizeof (uint16_t));
  for (i = 0; i < codes_len; ++i)
    {
      if (unlikely (codes[i] >= 16))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      if (count[codes[i]] == 0)
	{
	  start[codes[i]] = i;
	  prev[codes[i]] = i;
	}
      else
	{
	  next[prev[codes[i]]] = i;
	  prev[codes[i]] = i;
	}

      ++count[codes[i]];
    }

  /* For each length, fill in the table for the codes of that
     length.  */

  memset (table, 0, ZLIB_HUFFMAN_TABLE_SIZE * sizeof (uint16_t));

  /* Handle the values that do not require a secondary table.  */

  code = 0;
  for (j = 1; j <= 8; ++j)
    {
      unsigned int jcnt;
      unsigned int val;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      if (unlikely (jcnt > (1U << j)))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      /* There are JCNT values that have this length, the values
	 starting from START[j] continuing through NEXT[VAL].  Those
	 values are assigned consecutive values starting at CODE.  */

      val = start[j];
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  /* In the compressed bit stream, the value VAL is encoded as
	     J bits with the value C.  */

	  if (unlikely ((val & ~ZLIB_HUFFMAN_VALUE_MASK) != 0))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  tval = val | ((j - 1) << ZLIB_HUFFMAN_BITS_SHIFT);

	  /* The table lookup uses 8 bits.  If J is less than 8, we
	     don't know what the other bits will be.  We need to fill
	     in all possibilities in the table.  Since the Huffman
	     code is unambiguous, those entries can't be used for any
	     other code.  */

	  for (ind = code; ind < 0x100; ind += 1 << j)
	    {
	      if (unlikely (table[ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[ind] = tval;
	    }

	  /* Advance to the next value with this length.  */
	  if (i + 1 < jcnt)
	    val = next[val];

	  /* The Huffman codes are stored in the bitstream with the
	     most significant bit first, as is required to make them
	     unambiguous.  The effect is that when we read them from
	     the bitstream we see the bit sequence in reverse order:
	     the most significant bit of the Huffman code is the least
	     significant bit of the value we read from the bitstream.
	     That means that to make our table lookups work, we need
	     to reverse the bits of CODE.  Since reversing bits is
	     tedious and in general requires using a table, we instead
	     increment CODE in reverse order.  That is, if the number
	     of bits we are currently using, here named J, is 3, we
	     count as 000, 100, 010, 110, 001, 101, 011, 111, which is
	     to say the numbers from 0 to 7 but with the bits
	     reversed.  Going to more bits, aka incrementing J,
	     effectively just adds more zero bits as the beginning,
	     and as such does not change the numeric value of CODE.

	     To increment CODE of length J in reverse order, find the
	     most significant zero bit and set it to one while
	     clearing all higher bits.  In other words, add 1 modulo
	     2^J, only reversed.  */

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

  /* Handle the values that require a secondary table.  */

  /* Set FIRSTCODE, the number at which the codes start, for each
     length.  */

  for (j = 9; j < 16; j++)
    {
      unsigned int jcnt;
      unsigned int k;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      /* There are JCNT values that have this length, the values
	 starting from START[j].  Those values are assigned
	 consecutive values starting at CODE.  */

      firstcode[j - 9] = code;

      /* Reverse add JCNT to CODE modulo 2^J.  */
      for (k = 0; k < j; ++k)
	{
	  if ((jcnt & (1U << k)) != 0)
	    {
	      unsigned int m;
	      unsigned int bit;

	      bit = 1U << (j - k - 1);
	      for (m = 0; m < j - k; ++m, bit >>= 1)
		{
		  if ((code & bit) == 0)
		    {
		      code += bit;
		      break;
		    }
		  code &= ~bit;
		}
	      jcnt &= ~(1U << k);
	    }
	}
      if (unlikely (jcnt != 0))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
    }

  /* For J from 9 to 15, inclusive, we store COUNT[J] consecutive
     values starting at START[J] with consecutive codes starting at
     FIRSTCODE[J - 9].  In the primary table we need to point to the
     secondary table, and the secondary table will be indexed by J - 9
     bits.  We count down from 15 so that we install the larger
     secondary tables first, as the smaller ones may be embedded in
     the larger ones.  */

  next_secondary = 0; /* Index of next secondary table (after primary).  */
  for (j = 15; j >= 9; j--)
    {
      unsigned int jcnt;
      unsigned int val;
      size_t primary; /* Current primary index.  */
      size_t secondary; /* Offset to current secondary table.  */
      size_t secondary_bits; /* Bit size of current secondary table.  */

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      val = start[j];
      code = firstcode[j - 9];
      primary = 0x100;
      secondary = 0;
      secondary_bits = 0;
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  if ((code & 0xff) != primary)
	    {
	      uint16_t tprimary;

	      /* Fill in a new primary table entry.  */

	      primary = code & 0xff;

	      tprimary = table[primary];
	      if (tprimary == 0)
		{
		  /* Start a new secondary table.  */

		  if (unlikely ((next_secondary & ZLIB_HUFFMAN_VALUE_MASK)
				!= next_secondary))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }

		  secondary = next_secondary;
		  secondary_bits = j - 8;
		  next_secondary += 1 << secondary_bits;
		  table[primary] = (secondary
				    + ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT)
				    + (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT));
		}
	      else
		{
		  /* There is an existing entry.  It had better be a
		     secondary table with enough bits.  */
		  if (unlikely ((tprimary
				 & (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT))
				== 0))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		  secondary = tprimary & ZLIB_HUFFMAN_VALUE_MASK;
		  secondary_bits = ((tprimary >> ZLIB_HUFFMAN_BITS_SHIFT)
				    & ZLIB_HUFFMAN_BITS_MASK);
		  if (unlikely (secondary_bits < j - 8))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		}
	    }

	  /* Fill in secondary table entries.  */

	  tval = val | ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT);

	  for (ind = code >> 8;
	       ind < (1U << secondary_bits);
	       ind += 1U << (j - 8))
	    {
	      if (unlikely (table[secondary + 0x100 + ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[secondary + 0x100 + ind] = tval;
	    }

	  if (i + 1 < jcnt)
	    val = next[val];

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

#ifdef BACKTRACE_GENERATE_FIXED_HUFFMAN_TABLE
  final_next_secondary = next_secondary;
#endif

  return 1;
}